

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O1

void __thiscall
chrono::robosimian::RS_Part::RS_Part
          (RS_Part *this,string *name,shared_ptr<chrono::ChMaterialSurface> *mat,ChSystem *system)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  ChBodyAuxRef *pCVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ChBodyAuxRef *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  long local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  this->_vptr_RS_Part = (_func_int **)&PTR__RS_Part_0017d998;
  local_38 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)local_38;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar1,pcVar1 + name->_M_string_length);
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->m_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->m_spheres).
  super__Vector_base<chrono::robosimian::SphereShape,_std::allocator<chrono::robosimian::SphereShape>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_spheres).
  super__Vector_base<chrono::robosimian::SphereShape,_std::allocator<chrono::robosimian::SphereShape>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cylinders).
  super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cylinders).
  super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cylinders).
  super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_meshes).
  super__Vector_base<chrono::robosimian::MeshShape,_std::allocator<chrono::robosimian::MeshShape>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_meshes).
  super__Vector_base<chrono::robosimian::MeshShape,_std::allocator<chrono::robosimian::MeshShape>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_meshes).
  super__Vector_base<chrono::robosimian::MeshShape,_std::allocator<chrono::robosimian::MeshShape>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_boxes).
  super__Vector_base<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_boxes).
  super__Vector_base<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_boxes).
  super__Vector_base<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_spheres).
  super__Vector_base<chrono::robosimian::SphereShape,_std::allocator<chrono::robosimian::SphereShape>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_spheres).
  super__Vector_base<chrono::robosimian::SphereShape,_std::allocator<chrono::robosimian::SphereShape>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_spheres).
  super__Vector_base<chrono::robosimian::SphereShape,_std::allocator<chrono::robosimian::SphereShape>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cylinders).
  super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cylinders).
  super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_mesh_name)._M_dataplus._M_p = (pointer)&(this->m_mesh_name).field_2;
  (this->m_mesh_name)._M_string_length = 0;
  (this->m_mesh_name).field_2._M_local_buf[0] = '\0';
  (this->m_offset).m_data[0] = 0.0;
  (this->m_offset).m_data[1] = 0.0;
  (this->m_offset).m_data[2] = 0.0;
  (this->m_color).R = 1.0;
  (this->m_color).G = 1.0;
  (this->m_color).B = 1.0;
  local_58 = (ChBodyAuxRef *)(**(code **)(*(long *)system + 0x188))(system);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBodyAuxRef*>
            (&_Stack_50,local_58);
  _Var5._M_pi = _Stack_50._M_pi;
  pCVar4 = local_58;
  local_58 = (ChBodyAuxRef *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pCVar4;
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
  }
  peVar3 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pcVar1 = (name->_M_dataplus)._M_p;
  local_58 = (ChBodyAuxRef *)local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  std::__cxx11::string::_M_assign((string *)(peVar3 + 8));
  if (local_58 != (ChBodyAuxRef *)local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

RS_Part::RS_Part(const std::string& name, std::shared_ptr<ChMaterialSurface> mat, ChSystem* system)
    : m_name(name), m_mat(mat) {
    m_body = std::shared_ptr<ChBodyAuxRef>(system->NewBodyAuxRef());
    m_body->SetNameString(name + "_body");
}